

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O1

void Bmc_LoadTest(Gia_Man_t *pGia,int fLoadCnf,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  sat_solver *psVar2;
  int iVar3;
  uint uVar4;
  Bmc_Load_t *p;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char *__format;
  ulong uVar10;
  int Lit;
  timespec ts;
  int local_44;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p = Bmc_LoadStart(pGia);
  if (fLoadCnf != 0) {
    psVar2 = p->pSat;
    psVar2->pCnfMan = p;
    psVar2->pCnfFunc = Bmc_LoadAddCnf;
  }
  pVVar5 = pGia->vCos;
  uVar6 = (ulong)(uint)pVVar5->nSize;
  if (pGia->nRegs < pVVar5->nSize) {
    uVar10 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pVVar5->pArray[uVar10];
      if (((long)iVar3 < 0) || (iVar9 = pGia->nObjs, iVar9 <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGia->pObjs + iVar3;
      if (fLoadCnf == 0) {
        if (iVar9 <= iVar3) goto LAB_00540596;
        iVar3 = Bmc_LoadAddCnf_rec(p,iVar3 - (*(uint *)pGVar1 & 0x1fffffff));
      }
      else {
        if (iVar9 <= iVar3) {
LAB_00540596:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar3 = Bmc_LoadGetSatVar(p,iVar3 - (*(uint *)pGVar1 & 0x1fffffff));
      }
      if (iVar3 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      local_44 = (*(uint *)pGVar1 >> 0x1d & 1) + iVar3 * 2;
      if (fVerbose != 0) {
        printf("Frame%4d :  ",uVar10 & 0xffffffff);
        printf("Vars = %6d  ",(ulong)(uint)p->vSat2Id->nSize);
        uVar4 = sat_solver_nclauses(p->pSat);
        printf("Clas = %6d  ",(ulong)uVar4);
      }
      iVar3 = sat_solver_solve(p->pSat,&local_44,(lit *)&local_40,0,0,0,0);
      if (fVerbose != 0) {
        uVar4 = sat_solver_nconflicts(p->pSat);
        printf("Conf = %6d  ",(ulong)uVar4);
        __format = "UNDEC  ";
        if (iVar3 == 1) {
          __format = "SAT    ";
        }
        if (iVar3 == -1) {
          __format = "UNSAT  ";
        }
        printf(__format);
        iVar9 = 3;
        iVar3 = clock_gettime(3,&local_40);
        if (iVar3 < 0) {
          lVar8 = -1;
        }
        else {
          lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        Abc_Print(iVar9,"%s =","Time");
        Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar8 + lVar7) / 1000000.0);
      }
      uVar10 = uVar10 + 1;
      pVVar5 = pGia->vCos;
      uVar6 = (ulong)pVVar5->nSize;
    } while ((long)uVar10 < (long)(uVar6 - (long)pGia->nRegs));
  }
  printf("Callbacks = %d.  Loadings = %d.\n",(ulong)(uint)p->nCallBacks1,(ulong)(uint)p->nCallBacks2
        );
  Bmc_LoadStop(p);
  return;
}

Assistant:

void Bmc_LoadTest( Gia_Man_t * pGia, int fLoadCnf, int fVerbose )
{
    int nConfLimit = 0;
    Bmc_Load_t * p;
    Gia_Obj_t * pObj;
    int i, status, Lit;
    abctime clk = Abc_Clock();
    // create the loading manager
    p = Bmc_LoadStart( pGia );
    // add callback for CNF loading
    if ( fLoadCnf )
    {
        p->pSat->pCnfMan  = p;
        p->pSat->pCnfFunc = Bmc_LoadAddCnf;
    }
    // solve SAT problem for each PO
    Gia_ManForEachPo( pGia, pObj, i )
    {
        if ( fLoadCnf )
            Lit = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(pGia, pObj)), Gia_ObjFaninC0(pObj) );
        else
            Lit = Abc_Var2Lit( Bmc_LoadAddCnf_rec(p, Gia_ObjFaninId0p(pGia, pObj)), Gia_ObjFaninC0(pObj) );
        if ( fVerbose )
        {
            printf( "Frame%4d :  ", i );
            printf( "Vars = %6d  ", Vec_IntSize(p->vSat2Id) );
            printf( "Clas = %6d  ", sat_solver_nclauses(p->pSat) );
        }
        status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( fVerbose )
        {
            printf( "Conf = %6d  ", sat_solver_nconflicts(p->pSat) );
            if ( status == l_False )
                printf( "UNSAT  " );
            else if ( status == l_True )
                printf( "SAT    " );
            else // if ( status == l_Undec )
                printf( "UNDEC  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
    }
    printf( "Callbacks = %d.  Loadings = %d.\n", p->nCallBacks1, p->nCallBacks2 );
    Bmc_LoadStop( p );
}